

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorStatus.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorStatus::SetIFFMission(Mode5InterrogatorStatus *this,KUINT8 IFFM)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (IFFM < 8) {
    (this->m_StatusUnion).m_ui8Status = (this->m_StatusUnion).m_ui8Status & 0xf8 | IFFM;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SetIFFMission",&local_39);
  KException::KException(this_00,&local_38,8);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Mode5InterrogatorStatus::SetIFFMission(KUINT8 IFFM) noexcept(false)
{
	if( IFFM > 7 )throw KException( __FUNCTION__, INVALID_DATA );
	m_StatusUnion.m_ui8IffMis = IFFM;
}